

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
          (NegativeFramebufferCase *this,Context *context,char *name,char *desc,CaseType caseType)

{
  CaseType caseType_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  NegativeFramebufferCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__NegativeFramebufferCase_011c8e40;
  this->m_caseType = caseType;
  this->m_fboSize = 0x40;
  this->m_internalFormat = 0x8058;
  this->m_numSamples0 = -1;
  this->m_numSamples1 = -1;
  return;
}

Assistant:

NegativeFramebufferCase::NegativeFramebufferCase (Context& context, const char* name, const char* desc, CaseType caseType)
	: TestCase			(context, name, desc)
	, m_caseType		(caseType)
	, m_fboSize			(64)
	, m_internalFormat	(GL_RGBA8)
	, m_numSamples0		(-1)
	, m_numSamples1		(-1)
{
}